

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcache.c
# Opt level: O3

void duckdb_je_tcache_bin_flush_small
               (tsd_t *tsd,tcache_t *tcache,cache_bin_t *cache_bin,szind_t binind,uint rem)

{
  witness_t **ppwVar1;
  uint64_t *puVar2;
  size_t *psVar3;
  ticker_geom_t *ptVar4;
  undefined8 *puVar5;
  ulong *puVar6;
  char cVar7;
  uint64_t uVar8;
  emap_batch_lookup_result_t eVar9;
  void *pvVar10;
  edata_t *peVar11;
  undefined8 uVar12;
  szind_t sVar13;
  cache_bin_t *pcVar14;
  tsd_t *ptVar15;
  mutex_prof_data_t *pmVar16;
  int iVar17;
  size_t sVar18;
  emap_batch_lookup_result_t *peVar19;
  ulong uVar20;
  size_t sVar21;
  size_t sVar22;
  ulong extraout_RAX;
  ulong uVar23;
  bin_t *pbVar24;
  uint uVar25;
  pthread_mutex_t *ppVar26;
  long lVar27;
  long lVar28;
  mutex_prof_data_t *data_1;
  edata_t *peVar29;
  void **ppvVar30;
  uint uVar31;
  arena_t *paVar32;
  bin_t *pbVar33;
  pthread_mutex_t *__mutex;
  long lVar34;
  long *plVar35;
  ulong uVar36;
  uint src_ind;
  uint uVar37;
  long local_208 [33];
  undefined1 *local_100;
  tcache_t *local_f8;
  long local_f0;
  cache_bin_ptr_array_t local_e8;
  ulong local_d8;
  uint32_t *local_d0;
  bin_t *local_c8;
  ulong local_c0;
  uint local_b8;
  int local_b4;
  pthread_mutex_t *local_b0;
  arena_t *local_a8;
  ulong local_a0;
  ulong local_98;
  cache_bin_t *local_90;
  size_t local_88;
  size_t local_80;
  ulong local_78;
  ulong local_70;
  long local_68;
  emap_batch_lookup_result_t *local_60;
  uint local_58;
  szind_t local_54;
  tsd_t *local_50;
  uint local_44;
  bin_t *local_40;
  mutex_prof_data_t *data;
  
  __mutex = (pthread_mutex_t *)&DAT_00000001;
  local_f8 = tcache;
  duckdb_je_tcache_bin_flush_stashed(tsd,tcache,cache_bin,binind,true);
  uVar31 = *(int *)&cache_bin->low_bits_empty - (int)cache_bin->stack_head & 0xffff;
  uVar37 = uVar31 >> 3;
  if (uVar37 < (rem & 0xffff)) {
    rem = uVar37;
  }
  uVar37 = uVar37 - rem & 0xffff;
  uVar23 = (ulong)uVar37;
  local_f0 = (long)cache_bin->stack_head + ((ulong)uVar31 - (ulong)(uVar37 * 8));
  local_a0 = (ulong)binind;
  local_d0 = &duckdb_je_bin_infos[local_a0].nregs;
  uVar20 = 0;
  local_100 = (undefined1 *)local_208;
  local_c0 = uVar23;
  local_90 = cache_bin;
  local_54 = binind;
  local_50 = tsd;
  do {
    uVar31 = (int)uVar23 - (int)uVar20;
    if (0xff < uVar31) {
      uVar31 = 0x100;
    }
    local_70 = (ulong)uVar31;
    local_e8.n = (cache_bin_sz_t)uVar31;
    local_e8.ptr = (void **)(local_f0 + uVar20 * 8);
    local_a8 = local_f8->tcache_slow->arena;
    local_b8 = (uint)(tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_binshards).binshard
                     [local_a0];
    uVar36 = (ulong)(uVar31 * 8 + 0x17 & 0x1ff0);
    ppVar26 = (pthread_mutex_t *)(local_100 + -uVar36);
    local_b0 = ppVar26;
    local_78 = uVar20;
    ((emap_batch_lookup_result_t *)((long)ppVar26 - 8))->edata = (edata_t *)0x1d7e388;
    tcache_bin_flush_edatas_lookup
              (tsd,&local_e8,uVar31,(size_t)ppVar26,(emap_batch_lookup_result_t *)__mutex);
    lVar27 = (long)ppVar26 - uVar36;
    if ((int)uVar23 == (int)local_78) {
LAB_01d7eb1d:
      sVar13 = local_54;
      paVar32 = local_a8;
      *(undefined8 *)(lVar27 + -8) = 0x1d7eb31;
      pbVar24 = duckdb_je_arena_bin_choose((tsdn_t *)tsd,paVar32,sVar13,(uint *)0x0);
      ppVar26 = (pthread_mutex_t *)((long)&(pbVar24->lock).field_0 + 0x48);
      *(undefined8 *)(lVar27 + -8) = 0x1d7eb43;
      iVar17 = pthread_mutex_trylock(ppVar26);
      if (iVar17 != 0) {
        *(undefined8 *)(lVar27 + -8) = 0x1d7eb4f;
        duckdb_je_malloc_mutex_lock_slow(&pbVar24->lock);
        (pbVar24->lock).field_0.field_0.locked.repr = true;
      }
      tsd = local_50;
      puVar2 = &(pbVar24->lock).field_0.field_0.prof_data.n_lock_ops;
      *puVar2 = *puVar2 + 1;
      if (&((pbVar24->lock).field_0.field_0.prof_data.prev_owner)->tsd != local_50) {
        *(tsd_t **)((long)&(pbVar24->lock).field_0 + 0x30) = local_50;
        ppwVar1 = &(pbVar24->lock).field_0.witness.link.qre_prev;
        *ppwVar1 = (witness_t *)((long)&(*ppwVar1)->name + 1);
      }
      puVar2 = &(pbVar24->stats).nflushes;
      *puVar2 = *puVar2 + 1;
      puVar2 = &(pbVar24->stats).nrequests;
      *puVar2 = *puVar2 + (local_90->tstats).nrequests;
      (local_90->tstats).nrequests = 0;
      (pbVar24->lock).field_0.field_0.locked.repr = false;
      *(undefined8 *)(lVar27 + -8) = 0x1d7eb96;
      pthread_mutex_unlock(ppVar26);
      iVar17 = (int)local_78;
      uVar23 = local_c0;
    }
    else {
      local_b4 = (int)local_70 + -1;
      local_98 = 0;
      local_58 = 0;
      local_60 = (emap_batch_lookup_result_t *)0x0;
      uVar31 = 0;
      local_68 = lVar27;
      do {
        sVar13 = duckdb_je_bin_info_nbatched_sizes;
        uVar23 = (ulong)uVar31;
        peVar29 = ((emap_batch_lookup_result_t *)((long)local_b0 + uVar23 * 8))->edata;
        uVar37 = (uint)peVar29->e_bits;
        paVar32 = (arena_t *)duckdb_je_arenas[uVar37 & 0xfff].repr;
        if (paVar32 == (arena_t *)0x0) {
          paVar32 = (arena_t *)0x0;
        }
        uVar25 = (uint)(peVar29->e_bits >> 0x26) & 0x3f;
        pbVar33 = (bin_t *)((long)&paVar32->nthreads[(ulong)uVar25 * 0xa2].repr +
                           (ulong)duckdb_je_arena_bin_offsets[local_a0]);
        local_80 = CONCAT44(local_80._4_4_,duckdb_je_bin_info_nbatched_sizes);
        pbVar24 = (bin_t *)((long)&paVar32->nthreads[0].repr +
                           (ulong)(uVar25 << 8) + (ulong)duckdb_je_arena_bin_offsets[local_a0]);
        if (local_54 < duckdb_je_bin_info_nbatched_sizes) {
          pbVar24 = pbVar33;
        }
        local_44 = uVar31 + 1;
        if (local_44 < (uint)local_70) {
          uVar20 = (ulong)local_44;
          lVar34 = 0;
          do {
            peVar29 = *(edata_t **)((long)local_b0 + lVar34 * 8 + uVar20 * 8);
            uVar8 = peVar29->e_bits;
            if ((((uVar37 ^ (uint)uVar8) & 0xfff) == 0) &&
               (((uint)(uVar8 >> 0x26) & 0x3f) == uVar25)) {
              uVar36 = (ulong)local_44;
              eVar9 = *(emap_batch_lookup_result_t *)((long)local_b0 + uVar36 * 8);
              ((emap_batch_lookup_result_t *)((long)local_b0 + uVar36 * 8))->edata = peVar29;
              *(emap_batch_lookup_result_t *)((long)local_b0 + lVar34 * 8 + uVar20 * 8) = eVar9;
              pvVar10 = local_e8.ptr[uVar36];
              local_e8.ptr[uVar36] = local_e8.ptr[uVar20 + lVar34];
              local_e8.ptr[uVar20 + lVar34] = pvVar10;
              local_44 = local_44 + 1;
            }
            lVar34 = lVar34 + 1;
          } while (local_b4 - uVar31 != (int)lVar34);
        }
        local_88 = (size_t)(local_44 - uVar31);
        local_c8 = pbVar33;
        local_40 = pbVar24;
        data = (mutex_prof_data_t *)paVar32;
        if ((uVar25 == local_b8 && paVar32 == local_a8 || sVar13 <= local_54) ||
            duckdb_je_opt_bin_info_remote_free_max_batch < local_88) {
LAB_01d7e914:
          pbVar24 = local_40;
          tsd = local_50;
          *(undefined8 *)(lVar27 + -8) = 0x1d7e932;
          duckdb_je_tcache_bin_flush_small_cold_1();
          lVar34 = local_208[0];
          peVar19 = local_60;
          if ((extraout_RAX & 1) == 0) {
LAB_01d7e5d0:
            plVar35 = (long *)((long)&(pbVar24->lock).field_0 + lVar34);
            *plVar35 = *plVar35 + 1;
            peVar19 = local_60;
          }
LAB_01d7e5d4:
          ppvVar30 = local_e8.ptr;
          if (((arena_t *)data == local_a8) && ((local_98 & 1) == 0)) {
            puVar2 = &(pbVar24->stats).nflushes;
            *puVar2 = *puVar2 + 1;
            uVar8 = (local_90->tstats).nrequests;
            puVar2 = &(pbVar24->stats).nrequests;
            *puVar2 = *puVar2 + uVar8;
            (local_90->tstats).nrequests = 0;
            local_98 = CONCAT71((int7)(uVar8 >> 8),1);
          }
          local_d8 = (ulong)duckdb_je_arena_binind_div_info[local_a0].magic;
          if (uVar31 < local_44) {
            uVar31 = ~uVar31 + local_44;
            local_60 = (emap_batch_lookup_result_t *)((long)local_b0 + uVar23 * 8);
            lVar34 = 0;
            peVar29 = (edata_t *)peVar19;
            paVar32 = (arena_t *)data;
            do {
              pmVar16 = data;
              ptVar15 = local_50;
              peVar11 = local_60[lVar34].edata;
              uVar20 = ((long)ppvVar30[uVar23 + lVar34] - (long)peVar11->e_addr) * local_d8;
              puVar6 = (ulong *)((long)&peVar11->field_6 + (uVar20 >> 0x26) * 8);
              *puVar6 = *puVar6 ^ 1L << ((byte)(uVar20 >> 0x20) & 0x3f);
              uVar20 = peVar11->e_bits + 0x10000000;
              peVar11->e_bits = uVar20;
              uVar37 = (uint)(uVar20 >> 0x1c) & 0x3ff;
              peVar19 = (emap_batch_lookup_result_t *)peVar29;
              if (uVar37 == *local_d0) {
                *(undefined8 *)(lVar27 + -8) = 0x1d7e6bf;
                duckdb_je_arena_dalloc_bin_locked_handle_newly_empty
                          ((tsdn_t *)ptVar15,paVar32,peVar11,pbVar24);
                pbVar24 = local_40;
                paVar32 = (arena_t *)data;
                if (local_58 < (uint)local_70) {
                  *(edata_t **)(local_68 + (ulong)local_58 * 8) = peVar11;
                  local_58 = local_58 + 1;
                }
                else {
                  (peVar11->field_5).ql_link_active.qre_next = peVar11;
                  (peVar11->field_5).ql_link_active.qre_prev = peVar11;
                  peVar19 = (emap_batch_lookup_result_t *)peVar11;
                  if (peVar29 != (edata_t *)0x0) {
                    (peVar11->field_5).ql_link_active.qre_next =
                         (peVar29->field_5).ql_link_active.qre_prev;
                    (peVar29->field_5).ql_link_active.qre_prev = peVar11;
                    (peVar11->field_5).ql_link_active.qre_prev =
                         (((peVar11->field_5).ql_link_active.qre_prev)->field_5).ql_link_active.
                         qre_next;
                    (((peVar29->field_5).ql_link_active.qre_prev)->field_5).ql_link_active.qre_next
                         = peVar29;
                    (((peVar11->field_5).ql_link_active.qre_prev)->field_5).ql_link_active.qre_next
                         = peVar11;
                    peVar19 = (emap_batch_lookup_result_t *)
                              (peVar11->field_5).ql_link_active.qre_next;
                  }
                }
              }
              else if ((uVar37 == 1) && (pbVar24->slabcur != peVar11)) {
                *(undefined8 *)(lVar27 + -8) = 0x1d7e6fe;
                duckdb_je_arena_dalloc_bin_locked_handle_newly_nonempty
                          ((tsdn_t *)ptVar15,(arena_t *)pmVar16,peVar11,pbVar24);
                paVar32 = (arena_t *)data;
                pbVar24 = local_40;
              }
              lVar34 = lVar34 + 1;
              peVar29 = (edata_t *)peVar19;
            } while ((int)local_88 != (int)lVar34);
            lVar34 = (ulong)uVar31 + 1;
            tsd = local_50;
          }
          else {
            lVar34 = 0;
          }
          local_60 = peVar19;
          if (local_54 < (uint)local_80) {
            pbVar33 = local_c8 + 1;
            *(undefined8 *)(lVar27 + -8) = 0x1d7e796;
            sVar18 = duckdb_je_batcher_pop_begin((tsdn_t *)tsd,(batcher_t *)pbVar33);
            pbVar24 = local_40;
            if (sVar18 != 0xffffffffffffffff) {
              *(undefined8 *)(lVar27 + -8) = 0x1d7e7ae;
              sVar21 = duckdb_je_batcher_pop_get_pushes((tsdn_t *)tsd,(batcher_t *)pbVar33);
              pbVar24 = local_c8;
              if (sVar18 == 0) {
                *(undefined8 *)(lVar27 + -8) = 0x1d7e966;
                batcher_pop_end((tsdn_t *)tsd,(batcher_t *)pbVar33);
                pbVar24 = local_40;
              }
              else {
                lVar28 = 0;
                sVar22 = sVar18;
                local_80 = sVar21;
                do {
                  puVar5 = (undefined8 *)((long)&pbVar24[1].stats.curregs + lVar28);
                  uVar12 = puVar5[1];
                  *(undefined8 *)((long)local_208 + lVar28) = *puVar5;
                  *(undefined8 *)((long)local_208 + lVar28 + 8) = uVar12;
                  lVar28 = lVar28 + 0x10;
                  sVar22 = sVar22 - 1;
                } while (sVar22 != 0);
                *(undefined8 *)(lVar27 + -8) = 0x1d7e7f1;
                batcher_pop_end((tsdn_t *)tsd,(batcher_t *)pbVar33);
                plVar35 = local_208 + 1;
                paVar32 = (arena_t *)data;
                pbVar24 = local_40;
                sVar21 = sVar18;
                do {
                  pmVar16 = data;
                  ptVar15 = local_50;
                  peVar29 = (edata_t *)*plVar35;
                  uVar23 = (plVar35[-1] - (long)peVar29->e_addr) * local_d8;
                  puVar6 = (ulong *)((long)&peVar29->field_6 + (uVar23 >> 0x26) * 8);
                  *puVar6 = *puVar6 ^ 1L << ((byte)(uVar23 >> 0x20) & 0x3f);
                  uVar23 = peVar29->e_bits + 0x10000000;
                  peVar29->e_bits = uVar23;
                  uVar31 = (uint)(uVar23 >> 0x1c) & 0x3ff;
                  if (uVar31 == *local_d0) {
                    *(undefined8 *)(lVar27 + -8) = 0x1d7e861;
                    duckdb_je_arena_dalloc_bin_locked_handle_newly_empty
                              ((tsdn_t *)ptVar15,paVar32,peVar29,pbVar24);
                    pbVar24 = local_40;
                    paVar32 = (arena_t *)data;
                    if (local_58 < (uint)local_70) {
                      *(edata_t **)(local_68 + (ulong)local_58 * 8) = peVar29;
                      local_58 = local_58 + 1;
                    }
                    else {
                      (peVar29->field_5).ql_link_active.qre_next = peVar29;
                      (peVar29->field_5).ql_link_active.qre_prev = peVar29;
                      if (local_60 == (emap_batch_lookup_result_t *)0x0) {
                        local_60 = (emap_batch_lookup_result_t *)peVar29;
                      }
                      else {
                        (peVar29->field_5).ql_link_active.qre_next =
                             (((anon_union_24_2_895ac29c_for_edata_s_6 *)((long)local_60 + 0x28))->
                             ql_link_active).qre_prev;
                        (((anon_union_24_2_895ac29c_for_edata_s_6 *)((long)local_60 + 0x28))->
                        ql_link_active).qre_prev = peVar29;
                        (peVar29->field_5).ql_link_active.qre_prev =
                             (((peVar29->field_5).ql_link_active.qre_prev)->field_5).ql_link_active.
                             qre_next;
                        (((((anon_union_24_2_895ac29c_for_edata_s_6 *)((long)local_60 + 0x28))->
                          ql_link_active).qre_prev)->field_5).ql_link_active.qre_next =
                             (edata_t *)local_60;
                        (((peVar29->field_5).ql_link_active.qre_prev)->field_5).ql_link_active.
                        qre_next = peVar29;
                        local_60 = (emap_batch_lookup_result_t *)
                                   (peVar29->field_5).ql_link_active.qre_next;
                      }
                    }
                  }
                  else if ((uVar31 == 1) && (pbVar24->slabcur != peVar29)) {
                    *(undefined8 *)(lVar27 + -8) = 0x1d7e89d;
                    duckdb_je_arena_dalloc_bin_locked_handle_newly_nonempty
                              ((tsdn_t *)ptVar15,(arena_t *)pmVar16,peVar29,pbVar24);
                    paVar32 = (arena_t *)data;
                    pbVar24 = local_40;
                  }
                  plVar35 = plVar35 + 2;
                  sVar21 = sVar21 - 1;
                } while (sVar21 != 0);
                lVar34 = lVar34 + sVar18;
                sVar21 = local_80;
                tsd = local_50;
              }
              puVar2 = &(pbVar24->stats).batch_pops;
              *puVar2 = *puVar2 + 1;
              puVar2 = &(pbVar24->stats).batch_pushes;
              *puVar2 = *puVar2 + sVar21;
              puVar2 = &(pbVar24->stats).batch_pushed_elems;
              *puVar2 = *puVar2 + sVar18;
            }
          }
          lVar28 = local_68;
          puVar2 = &(pbVar24->stats).ndalloc;
          *puVar2 = *puVar2 + lVar34;
          psVar3 = &(pbVar24->stats).curregs;
          *psVar3 = *psVar3 - lVar34;
          (pbVar24->lock).field_0.field_0.locked.repr = false;
          __mutex = (pthread_mutex_t *)((long)&(pbVar24->lock).field_0 + 0x48);
          *(undefined8 *)(lVar27 + -8) = 0x1d7e99f;
          pthread_mutex_unlock(__mutex);
        }
        else {
          *(undefined8 *)(lVar27 + -8) = 0x1d7e523;
          iVar17 = pthread_mutex_trylock((pthread_mutex_t *)((long)&(pbVar24->lock).field_0 + 0x48))
          ;
          ptVar15 = local_50;
          sVar18 = local_88;
          if (iVar17 == 0) {
            puVar2 = &(pbVar24->lock).field_0.field_0.prof_data.n_lock_ops;
            *puVar2 = *puVar2 + 1;
            peVar19 = local_60;
            tsd = local_50;
            if (&((pbVar24->lock).field_0.field_0.prof_data.prev_owner)->tsd != local_50) {
              *(tsd_t **)((long)&(pbVar24->lock).field_0 + 0x30) = local_50;
              lVar34 = 0x28;
              goto LAB_01d7e5d0;
            }
            goto LAB_01d7e5d4;
          }
          *(undefined8 *)(lVar27 + -8) = 0x1d7e543;
          sVar18 = duckdb_je_batcher_push_begin((tsdn_t *)ptVar15,(batcher_t *)(pbVar24 + 1),sVar18)
          ;
          tsd = local_50;
          __mutex = local_b0;
          if (sVar18 == 0xffffffffffffffff) goto LAB_01d7e914;
          if (local_44 != uVar31) {
            peVar19 = (emap_batch_lookup_result_t *)(&local_40[1].stats.nfills + sVar18 * 2);
            sVar18 = local_88;
            do {
              peVar19[-1] = *(emap_batch_lookup_result_t *)(local_e8.ptr + uVar31);
              *peVar19 = *(emap_batch_lookup_result_t *)((long)local_b0 + (ulong)uVar31 * 8);
              uVar31 = uVar31 + 1;
              peVar19 = peVar19 + 2;
              sVar18 = sVar18 - 1;
            } while (sVar18 != 0);
          }
          *(undefined8 *)(lVar27 + -8) = 0x1d7e5a3;
          batcher_push_end((tsdn_t *)tsd,(batcher_t *)(pbVar24 + 1));
          lVar28 = local_68;
        }
        pmVar16 = data;
        if (tsd != (tsd_t *)0x0) {
          cVar7 = tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_reentrancy_level;
          ptVar4 = &tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_arena_decay_ticker;
          ptVar4->tick = ptVar4->tick - (int)local_88;
          if (ptVar4->tick < 0) {
            if (cVar7 < '\x01') {
              uVar23 = tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_prng_state *
                       0x5851f42d4c957f2d + 0x14057b7ef767814f;
              tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_prng_state = uVar23;
              (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_arena_decay_ticker).tick =
                   (int32_t)(((ulong)duckdb_je_ticker_geom_table[uVar23 >> 0x3a] *
                             (long)(tsd->
                                   cant_access_tsd_items_directly_use_a_getter_or_setter_arena_decay_ticker
                                   ).nticks) / 0x3d);
              *(undefined8 *)(lVar27 + -8) = 0x1d7ea4f;
              duckdb_je_arena_decay((tsdn_t *)tsd,(arena_t *)pmVar16,false,false);
            }
            else {
              (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_arena_decay_ticker).tick =
                   0;
            }
          }
        }
        uVar31 = local_44;
      } while (local_44 < (uint)local_70);
      uVar20 = local_c0;
      peVar19 = local_60;
      if (local_58 != 0) {
        uVar23 = (ulong)local_58;
        uVar36 = 0;
        do {
          peVar29 = *(edata_t **)(lVar28 + uVar36 * 8);
          paVar32 = (arena_t *)duckdb_je_arenas[(uint)peVar29->e_bits & 0xfff].repr;
          *(undefined8 *)(lVar27 + -8) = 0x1d7ea84;
          duckdb_je_arena_slab_dalloc((tsdn_t *)tsd,paVar32,peVar29);
          uVar36 = uVar36 + 1;
          uVar20 = local_c0;
          peVar19 = local_60;
        } while (uVar23 != uVar36);
      }
      while (uVar23 = local_c0, peVar19 != (emap_batch_lookup_result_t *)0x0) {
        peVar29 = (((edata_t *)peVar19)->field_5).ql_link_active.qre_next;
        if ((emap_batch_lookup_result_t *)peVar29 == peVar19) {
          peVar29 = (edata_t *)0x0;
        }
        else {
          (((((edata_t *)peVar19)->field_5).ql_link_active.qre_prev)->field_5).ql_link_active.
          qre_next = (peVar29->field_5).ql_link_active.qre_prev;
          peVar11 = (((edata_t *)peVar19)->field_5).ql_link_active.qre_prev;
          (((((edata_t *)peVar19)->field_5).ql_link_active.qre_next)->field_5).ql_link_active.
          qre_prev = peVar11;
          (((edata_t *)peVar19)->field_5).ql_link_active.qre_prev =
               (peVar11->field_5).ql_link_active.qre_next;
          peVar11 = (((edata_t *)peVar19)->field_5).ql_link_active.qre_next;
          (((peVar11->field_5).ql_link_active.qre_prev)->field_5).ql_link_active.qre_next = peVar11;
          (((((edata_t *)peVar19)->field_5).ql_link_active.qre_prev)->field_5).ql_link_active.
          qre_next = (edata_t *)peVar19;
        }
        paVar32 = (arena_t *)duckdb_je_arenas[(uint)((edata_t *)peVar19)->e_bits & 0xfff].repr;
        local_c0 = uVar20;
        *(undefined8 *)(lVar27 + -8) = 0x1d7eb04;
        duckdb_je_arena_slab_dalloc((tsdn_t *)tsd,paVar32,(edata_t *)peVar19);
        uVar20 = local_c0;
        peVar19 = (emap_batch_lookup_result_t *)peVar29;
        local_c0 = uVar23;
      }
      iVar17 = (int)local_78;
      local_c0 = uVar20;
      if ((local_98 & 1) == 0) goto LAB_01d7eb1d;
    }
    pcVar14 = local_90;
    uVar31 = (int)local_70 + iVar17;
    uVar20 = (ulong)uVar31;
    uVar37 = (uint)uVar23;
    if (uVar37 <= uVar31) {
      ppvVar30 = local_90->stack_head;
      iVar17 = *(int *)&local_90->low_bits_empty;
      *(undefined8 *)(local_100 + -8) = 0x1d7ebf2;
      memmove((void *)((long)ppvVar30 + (ulong)(uVar37 * 8)),ppvVar30,
              (ulong)(((iVar17 - (int)ppvVar30 & 0xffffU) >> 3) - uVar37) << 3);
      ppvVar30 = (void **)((ulong)(uVar37 * 8) + (long)pcVar14->stack_head);
      pcVar14->stack_head = ppvVar30;
      if ((ushort)((*(int *)&pcVar14->low_bits_empty - (int)ppvVar30 & 0xffffU) >> 3) <
          (ushort)((short)*(int *)&pcVar14->low_bits_empty - pcVar14->low_bits_low_water) >> 3) {
        pcVar14->low_bits_low_water = (uint16_t)ppvVar30;
      }
      return;
    }
  } while( true );
}

Assistant:

void
tcache_bin_flush_small(tsd_t *tsd, tcache_t *tcache, cache_bin_t *cache_bin,
    szind_t binind, unsigned rem) {
	tcache_bin_flush_bottom(tsd, tcache, cache_bin, binind, rem,
	    /* small */ true);
}